

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
::
TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
          (TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
           *this)

{
  TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockParameterTest_twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell_0035f280
  ;
  return;
}

Assistant:

TEST(MockParameterTest, twoOutputParameterOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds)
{
    int param1 = 1;
    int param2 = 1;
    int retval1 = 2;
    int retval2 = 3;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &retval1, sizeof(retval1));
    mock().expectOneCall("foo").withOutputParameterReturning("bar", &retval2, sizeof(retval2));
    mock().actualCall("foo").withOutputParameter("bar", &param1);
    mock().actualCall("foo").withOutputParameter("bar", &param2);

    CHECK_EQUAL(2, retval1);
    CHECK_EQUAL(2, param1);
    CHECK_EQUAL(3, retval2);
    CHECK_EQUAL(3, param2);
    mock().checkExpectations();
}